

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall EthBasePort::OnFwBusReset(EthBasePort *this,uint FwBusGeneration_FPGA)

{
  ostream *poVar1;
  void *pvVar2;
  uint FwBusGeneration_FPGA_local;
  EthBasePort *this_local;
  
  poVar1 = std::operator<<((this->super_BasePort).outStr,"Firewire bus reset, FPGA = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,FwBusGeneration_FPGA);
  poVar1 = std::operator<<(poVar1,", PC = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->super_BasePort).FwBusGeneration);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void EthBasePort::OnFwBusReset(unsigned int FwBusGeneration_FPGA)
{
    outStr << "Firewire bus reset, FPGA = " << std::dec << FwBusGeneration_FPGA << ", PC = " << FwBusGeneration << std::endl;
}